

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O0

void __thiscall xray_re::xr_motion_marks::save(xr_motion_marks *this,xr_writer *w)

{
  size_type value;
  xr_writer *w_local;
  xr_motion_marks *this_local;
  
  xr_writer::w_s(w,&this->m_name);
  value = std::vector<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>::size
                    (&this->
                      super_vector<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>);
  xr_writer::w_size_u32(w,value);
  xr_writer::w_seq<xray_re::xr_motion_marks>(w,this);
  return;
}

Assistant:

void xr_motion_marks::save(xr_writer& w) const
{
	w.w_s(m_name);
	w.w_size_u32(size());
	w.w_seq(*this);
}